

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O0

vm_obj_id_t
CVmDynamicFunc::create
          (int in_root_set,vm_obj_id_t globals,vm_obj_id_t locals,vm_obj_id_t macros,
          vm_val_t *srcval,char *src,size_t src_len)

{
  vm_obj_id_t vVar1;
  vm_obj_id_t id;
  CVmDynCompResults results;
  CVmDynamicCompiler *comp;
  vm_val_t *in_stack_00000708;
  vm_obj_id_t in_stack_00000710;
  vm_obj_id_t in_stack_00000714;
  vm_obj_id_t in_stack_00000718;
  int in_stack_0000071c;
  CVmDynamicCompiler *in_stack_00000720;
  char *in_stack_00000730;
  size_t in_stack_00000738;
  CVmDynCompMode in_stack_00000740;
  CVmDynCompDebug *in_stack_00000748;
  CVmDynCompResults *in_stack_00000750;
  CVmDynCompResults *this;
  CVmDynCompResults local_48;
  CVmDynamicCompiler *local_30;
  
  local_30 = CVmDynamicCompiler::get();
  CVmDynCompResults::CVmDynCompResults(&local_48);
  this = (CVmDynCompResults *)0x0;
  vVar1 = CVmDynamicCompiler::compile
                    (in_stack_00000720,in_stack_0000071c,in_stack_00000718,in_stack_00000714,
                     in_stack_00000710,in_stack_00000708,in_stack_00000730,in_stack_00000738,
                     in_stack_00000740,in_stack_00000748,in_stack_00000750);
  if (vVar1 == 0) {
    CVmDynCompResults::throw_error(this);
  }
  CVmDynCompResults::~CVmDynCompResults((CVmDynCompResults *)0x2d9b42);
  return vVar1;
}

Assistant:

vm_obj_id_t CVmDynamicFunc::create(VMG_ int in_root_set,
                                   vm_obj_id_t globals,
                                   vm_obj_id_t locals,
                                   vm_obj_id_t macros,
                                   const vm_val_t *srcval,
                                   const char *src, size_t src_len)
{
    /* get the compiler interface */
    CVmDynamicCompiler *comp = CVmDynamicCompiler::get(vmg0_);

    /* compile the code and create a code object */
    CVmDynCompResults results;
    vm_obj_id_t id = comp->compile(
        vmg_ in_root_set, globals, locals, macros,
        srcval, src, src_len, DCModeAuto, 0, &results);

    /* if an error occurred, throw the error */
    if (id == VM_INVALID_OBJ)
        results.throw_error(vmg0_);

    /* return the new ID */
    return id;
}